

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::Calc_Sxi_zeta_compact
          (ChElementBeamANCF_3333 *this,VectorN *Sxi_zeta_compact,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = xi;
  auVar2 = auVar3._0_16_;
  auVar1 = vfmsub213sd_fma(auVar2,auVar2,auVar2);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[0] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[1] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[2] = auVar1._0_8_ * this->m_thicknessZ * 0.25;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[3] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[4] = 0.0;
  auVar1 = vfmadd213sd_fma(auVar2,auVar2,auVar2);
  auVar2 = vfnmadd213sd_fma(auVar2,auVar2,ZEXT816(0x3ff0000000000000));
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[5] = auVar1._0_8_ * this->m_thicknessZ * 0.25;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[6] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[7] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[8] = auVar2._0_8_ * this->m_thicknessZ * 0.5;
  return;
}

Assistant:

void ChElementBeamANCF_3333::Calc_Sxi_zeta_compact(VectorN& Sxi_zeta_compact, double xi, double eta, double zeta) {
    Sxi_zeta_compact(0) = 0.0;
    Sxi_zeta_compact(1) = 0.0;
    Sxi_zeta_compact(2) = 0.25 * m_thicknessZ * (xi * xi - xi);
    Sxi_zeta_compact(3) = 0.0;
    Sxi_zeta_compact(4) = 0.0;
    Sxi_zeta_compact(5) = 0.25 * m_thicknessZ * (xi * xi + xi);
    Sxi_zeta_compact(6) = 0.0;
    Sxi_zeta_compact(7) = 0.0;
    Sxi_zeta_compact(8) = 0.5 * m_thicknessZ * (1 - xi * xi);
}